

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::shrS(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  BasicType BVar4;
  Index IVar5;
  Type local_30;
  Type local_28;
  Literal *local_20;
  Literal *other_local;
  Literal *this_local;
  
  local_20 = other;
  other_local = this;
  this_local = __return_storage_ptr__;
  BVar4 = wasm::Type::getBasic(&this->type);
  if (BVar4 == i32) {
    iVar1 = (this->field_0).i32;
    IVar5 = (local_20->field_0).i32;
    wasm::Type::Type(&local_28,i32);
    IVar5 = Bits::getEffectiveShifts(IVar5,local_28);
    Literal(__return_storage_ptr__,iVar1 >> ((byte)IVar5 & 0x1f));
  }
  else {
    if (BVar4 != i64) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x57a);
    }
    lVar2 = (this->field_0).i64;
    sVar3 = (local_20->field_0).func.super_IString.str._M_len;
    wasm::Type::Type(&local_30,i64);
    IVar5 = Bits::getEffectiveShifts((Index)sVar3,local_30);
    Literal(__return_storage_ptr__,lVar2 >> ((byte)IVar5 & 0x3f));
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::shrS(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(i32 >> Bits::getEffectiveShifts(other.i32, Type::i32));
    case Type::i64:
      return Literal(i64 >> Bits::getEffectiveShifts(other.i64, Type::i64));
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}